

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

Instr * __thiscall
Peeps::HoistSameInstructionAboveSplit(Peeps *this,BranchInstr *branchInstr,Instr *instrNext)

{
  IRKind IVar1;
  OpCode OVar2;
  LabelInstr *pLVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  BranchInstr *pBVar8;
  LabelInstr *pLVar9;
  Instr *pIVar10;
  BranchInstr *this_00;
  Instr *pIVar11;
  Instr *pIVar12;
  char *message;
  char *error;
  uint lineNumber;
  BranchInstr *instr1;
  Instr *local_38;
  
  if (branchInstr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2aa,"(branchInstr)","branchInstr");
    if (!bVar5) goto LAB_00625489;
    *puVar6 = 0;
  }
  OVar2 = (branchInstr->super_Instr).m_opcode;
  if (OVar2 < ADD) {
    bVar5 = OVar2 == MultiBr || OVar2 == Br;
  }
  else {
    bVar5 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
  }
  if (bVar5 != false) {
    return instrNext;
  }
  pLVar3 = branchInstr->m_branchTarget;
  if (pLVar3 == (LabelInstr *)0x0) {
    if (branchInstr->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_00625003;
    }
  }
  else if (branchInstr->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_00625003:
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,lineNumber,error,message);
    if (!bVar5) goto LAB_00625489;
    *puVar6 = 0;
  }
  if (pLVar3 == (LabelInstr *)0x0) {
    return instrNext;
  }
  if ((branchInstr->super_Instr).m_opcode < ADD) {
    return instrNext;
  }
  pLVar3 = branchInstr->m_branchTarget;
  if (pLVar3 == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2b1,"(targetLabel)","targetLabel");
    if (!bVar5) goto LAB_00625489;
    *puVar6 = 0;
  }
  if (1 < (pLVar3->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
          count) {
    return instrNext;
  }
  pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(&pLVar3->super_Instr);
  if (pIVar7 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,699,"(targetPrev)","targetPrev");
    if (!bVar5) goto LAB_00625489;
    *puVar6 = 0;
  }
  if (pIVar7->m_kind == InstrKindBranch) {
    OVar2 = pIVar7->m_opcode;
    if (OVar2 < ADD) {
      bVar5 = OVar2 == MultiBr || OVar2 == Br;
    }
    else {
      bVar5 = LowererMD::IsUnconditionalBranch(pIVar7);
    }
    if (bVar5 == false) goto LAB_00625136;
  }
  else {
LAB_00625136:
    bVar5 = OpCodeAttr::HasFallThrough(pIVar7->m_opcode);
    if (bVar5) {
      return instrNext;
    }
  }
  pBVar8 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  if (pBVar8 == (BranchInstr *)0x0) {
    instr1 = (BranchInstr *)0x0;
  }
  else {
    instr1 = (BranchInstr *)0x0;
    do {
      IVar1 = (pBVar8->super_Instr).m_kind;
      if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
        pLVar9 = IR::Instr::AsLabelInstr(&pBVar8->super_Instr);
        if (instr1 == (BranchInstr *)0x0 || (pLVar9->field_0x78 & 2) != 0) {
          return instrNext;
        }
        goto LAB_006251c9;
      }
      if (IVar1 == InstrKindEntry) break;
      if (instr1 == (BranchInstr *)0x0) {
        bVar5 = EncoderMD::SetsConditionCode(&pBVar8->super_Instr);
        instr1 = (BranchInstr *)0x0;
        if (bVar5) {
          instr1 = pBVar8;
        }
      }
      pBVar8 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pBVar8->super_Instr);
    } while (pBVar8 != (BranchInstr *)0x0);
  }
  if (instr1 != (BranchInstr *)0x0) {
LAB_006251c9:
    pBVar8 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
    pIVar7 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
    pIVar10 = IR::Instr::GetNextRealInstrOrLabel(&pLVar3->super_Instr);
    if (pIVar7 == (Instr *)0x0 || pIVar10 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x2e3,"(instr && targetInstr)","instr && targetInstr");
      if (!bVar5) {
LAB_00625489:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_00 = branchInstr;
    if (instr1 == pBVar8) {
      this_00 = instr1;
    }
    local_38 = (Instr *)0x0;
    while ((((((IVar1 = pIVar7->m_kind, IVar1 != InstrKindBranch && (IVar1 != InstrKindExit)) &&
              (2 < pIVar7->m_opcode - 0x23)) &&
             ((1 < pIVar7->m_opcode - 0x173 && (IVar1 != InstrKindLabel)))) &&
            ((IVar1 != InstrKindProfiledLabel &&
             ((bVar5 = IR::Instr::IsEqual(pIVar7,pIVar10), bVar5 &&
              (bVar5 = EncoderMD::UsesConditionCode(pIVar7), !bVar5)))))) &&
           ((bVar5 = EncoderMD::SetsConditionCode(pIVar7), !bVar5 &&
            ((bVar5 = AgenPeeps::DependentInstrs(&this->peepsAgen,&instr1->super_Instr,pIVar7),
             !bVar5 && (pIVar7->m_opcode != InlineeStart))))))) {
      pIVar11 = IR::Instr::GetNextRealInstrOrLabel(pIVar7);
      pIVar12 = IR::Instr::GetNextRealInstrOrLabel(pIVar10);
      IR::Instr::Unlink(pIVar7);
      IR::Instr::InsertBefore(&this_00->super_Instr,pIVar7);
      IR::Instr::Remove(pIVar10);
      if (local_38 == (Instr *)0x0) {
        local_38 = pIVar7;
      }
      pIVar7 = pIVar11;
      pIVar10 = pIVar12;
      if ((pIVar11 == (Instr *)0x0) || (pIVar12 == (Instr *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x2fe,"(instr && targetInstr)","instr && targetInstr");
        if (!bVar5) goto LAB_00625489;
        *puVar6 = 0;
      }
    }
    if ((local_38 != (Instr *)0x0) && (instrNext = local_38, pIVar10->m_kind == InstrKindBranch)) {
      pBVar8 = IR::Instr::AsBranchInstr(pIVar10);
      OVar2 = (pBVar8->super_Instr).m_opcode;
      if (OVar2 < ADD) {
        bVar5 = OVar2 == MultiBr || OVar2 == Br;
      }
      else {
        bVar5 = LowererMD::IsUnconditionalBranch(&pBVar8->super_Instr);
      }
      if ((bVar5 != false) && (bVar5 = IR::BranchInstr::IsMultiBranch(pBVar8), !bVar5)) {
        IR::BranchInstr::ReplaceTarget(branchInstr,pLVar3,pBVar8->m_branchTarget);
      }
      if ((pLVar3->field_0x78 & 4) == 0 &&
          (SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
          (pLVar3->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar3->labelRefs) {
        PeepUnreachableLabel(pLVar3,(bool)((pLVar3->field_0x78 & 2) >> 1),(bool *)0x0);
      }
    }
  }
  return instrNext;
}

Assistant:

IR::Instr *
Peeps::HoistSameInstructionAboveSplit(IR::BranchInstr *branchInstr, IR::Instr *instrNext)
{
    Assert(branchInstr);
    if (!branchInstr->IsConditional() || branchInstr->IsMultiBranch() || !branchInstr->IsLowered())
    {
        return instrNext;   // this optimization only applies to single conditional branch
    }

    IR::LabelInstr *targetLabel = branchInstr->GetTarget();
    Assert(targetLabel);

    // give up if there are other branch entries to the target label
    if (targetLabel->labelRefs.Count() > 1)
    {
        return instrNext;
    }

    // Give up if previous instruction before target label has fallthrough, cannot hoist up
    IR::Instr *targetPrev = targetLabel->GetPrevRealInstrOrLabel();
    Assert(targetPrev);
    if (targetPrev->HasFallThrough())
    {
        return instrNext;
    }

    IR::Instr *instrSetCondition = NULL;
    IR::Instr *branchPrev = branchInstr->GetPrevRealInstrOrLabel();
    while (branchPrev && !branchPrev->StartsBasicBlock())
    {
        if (!instrSetCondition && EncoderMD::SetsConditionCode(branchPrev))
        {   // located compare instruction for the branch
            instrSetCondition = branchPrev;
        }
        branchPrev = branchPrev->GetPrevRealInstrOrLabel(); // keep looking previous instr in BB
    }

    if (branchPrev && branchPrev->IsLabelInstr() && branchPrev->AsLabelInstr()->isOpHelper)
    {   // don't apply the optimization when branch is in helper section
        return instrNext;
    }

    if (!instrSetCondition)
    {   // give up if we cannot find the compare instruction in the BB, should be very rare
        return instrNext;
    }
    Assert(instrSetCondition);

    bool hoistAboveSetConditionInstr = false;
    if (instrSetCondition == branchInstr->GetPrevRealInstrOrLabel())
    {   // if compare instruction is right before branch instruction, we can hoist above cmp instr
        hoistAboveSetConditionInstr = true;
    }   // otherwise we hoist the identical instructions above conditional branch split only

    IR::Instr *instr = branchInstr->GetNextRealInstrOrLabel();
    IR::Instr *targetInstr = targetLabel->GetNextRealInstrOrLabel();
    IR::Instr *branchNextInstr = NULL;
    IR::Instr *targetNextInstr = NULL;
    IR::Instr *instrHasHoisted = NULL;

    Assert(instr && targetInstr);
    while (!instr->EndsBasicBlock() && !instr->IsLabelInstr() && instr->IsEqual(targetInstr) &&
        !EncoderMD::UsesConditionCode(instr) && !EncoderMD::SetsConditionCode(instr) &&
        !this->peepsAgen.DependentInstrs(instrSetCondition, instr) &&
        // cannot hoist InlineeStart from branch targets even for the same inlinee function.
        // it is used by encoder to generate InlineeFrameRecord for each inlinee
        instr->m_opcode != Js::OpCode::InlineeStart)
    {
        branchNextInstr = instr->GetNextRealInstrOrLabel();
        targetNextInstr = targetInstr->GetNextRealInstrOrLabel();

        instr->Unlink();                            // hoist up instr in fallthrough branch
        if (hoistAboveSetConditionInstr)
        {
            instrSetCondition->InsertBefore(instr); // hoist above compare instruction
        }
        else
        {
            branchInstr->InsertBefore(instr);       // hoist above branch split
        }
        targetInstr->Remove();                      // remove the same instruction in target branch

        if (!instrHasHoisted)
            instrHasHoisted = instr;                // points to the first hoisted instruction

        instr = branchNextInstr;
        targetInstr = targetNextInstr;
        Assert(instr && targetInstr);
    }

    if (instrHasHoisted)
    {   // instructions have been hoisted, now check tail branch to see if it can be duplicated
        if (targetInstr->IsBranchInstr())
        {
            IR::BranchInstr *tailBranch = targetInstr->AsBranchInstr();
            if (tailBranch->IsUnconditional() && !tailBranch->IsMultiBranch())
            {   // target can be replaced since tail branch is a single unconditional jmp
                branchInstr->ReplaceTarget(targetLabel, tailBranch->GetTarget());
            }

            // now targeLabel is an empty Basic Block, remove it if it's not referenced
            if (targetLabel->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetLabel, targetLabel->isOpHelper);
            }
        }
        return instrHasHoisted;
    }

    return instrNext;
}